

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::
GenerateSerializedSizeCode(RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  bool bVar1;
  Type type;
  int iVar2;
  char *pcVar3;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"{\n  int dataSize = 0;\n");
  io::Printer::Indent(printer);
  type = GetType(this->descriptor_);
  iVar2 = FixedSize(type);
  pcVar3 = "dataSize = $fixed_size$ * get$capitalized_name$List().size();\n";
  if (iVar2 == -1) {
    pcVar3 = 
    "for (int i = 0; i < $name$_.size(); i++) {\n  dataSize += com.google.protobuf.CodedOutputStream\n    .compute$capitalized_type$SizeNoTag($name$_.get(i));\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar3);
  io::Printer::Print(printer,"size += dataSize;\n");
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  pcVar3 = "size += $tag_size$ * get$capitalized_name$List().size();\n";
  if (bVar1) {
    pcVar3 = 
    "if (!get$capitalized_name$List().isEmpty()) {\n  size += $tag_size$;\n  size += com.google.protobuf.CodedOutputStream\n      .computeInt32SizeNoTag(dataSize);\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar3);
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,variables,"$name$MemoizedSerializedSize = dataSize;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int dataSize = 0;\n");
  printer->Indent();

  if (FixedSize(GetType(descriptor_)) == -1) {
    printer->Print(variables_,
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  dataSize += com.google.protobuf.CodedOutputStream\n"
      "    .compute$capitalized_type$SizeNoTag($name$_.get(i));\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "dataSize = $fixed_size$ * get$capitalized_name$List().size();\n");
  }

  printer->Print(
      "size += dataSize;\n");

  if (descriptor_->is_packed()) {
    printer->Print(variables_,
      "if (!get$capitalized_name$List().isEmpty()) {\n"
      "  size += $tag_size$;\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "      .computeInt32SizeNoTag(dataSize);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * get$capitalized_name$List().size();\n");
  }

  // cache the data size for packed fields.
  if (descriptor_->is_packed()) {
    printer->Print(variables_,
      "$name$MemoizedSerializedSize = dataSize;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}